

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O3

bool mocker::runOptPasses<mocker::SSAConstruction>(Module *module)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  
  for (p_Var2 = (module->funcs)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    ir::FunctionModule::buildContext((FunctionModule *)(p_Var2 + 5));
  }
  bVar1 = detail::runOptPassImpl<mocker::SSAConstruction>(module,(FuncPass *)0x0);
  for (p_Var2 = (module->funcs)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    ir::FunctionModule::buildContext((FunctionModule *)(p_Var2 + 5));
  }
  ir::verifyModule(module);
  return bVar1;
}

Assistant:

bool runOptPasses(ir::Module &module, Args &&... args) {
  for (auto &func : module.getFuncs())
    func.second.buildContext();
  auto res = detail::runOptPassImpl<Pass>(module, (Pass *)(nullptr),
                                          std::forward<Args>(args)...);
  for (auto &func : module.getFuncs())
    func.second.buildContext();
  ir::verifyModule(module);
  return res;
}